

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFYAML.h
# Opt level: O3

void llvm::yaml::ScalarEnumerationTraits<llvm::dwarf::Tag,_void>::enumeration(IO *io,Tag *value)

{
  int iVar1;
  
  iVar1 = (*io->_vptr_IO[2])();
  iVar1 = (*io->_vptr_IO[0x15])(io,"DW_TAG_null",(ulong)(*value == DW_TAG_null & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_TAG_null;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_TAG_array_type",(ulong)(*value == DW_TAG_array_type & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_TAG_array_type;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_TAG_class_type",(ulong)(*value == DW_TAG_class_type & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_TAG_class_type;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_TAG_entry_point",(ulong)(*value == DW_TAG_entry_point & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_TAG_entry_point;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_TAG_enumeration_type",
                     (ulong)(*value == DW_TAG_enumeration_type & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_TAG_enumeration_type;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_TAG_formal_parameter",
                     (ulong)(*value == DW_TAG_formal_parameter & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_TAG_formal_parameter;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_TAG_imported_declaration",
                     (ulong)(*value == DW_TAG_imported_declaration & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_TAG_imported_declaration;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])(io,"DW_TAG_label",(ulong)(*value == DW_TAG_label & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_TAG_label;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_TAG_lexical_block",(ulong)(*value == DW_TAG_lexical_block & (byte)iVar1)
                    );
  if ((char)iVar1 != '\0') {
    *value = DW_TAG_lexical_block;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])(io,"DW_TAG_member",(ulong)(*value == DW_TAG_member & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_TAG_member;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_TAG_pointer_type",(ulong)(*value == DW_TAG_pointer_type & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_TAG_pointer_type;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_TAG_reference_type",
                     (ulong)(*value == DW_TAG_reference_type & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_TAG_reference_type;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_TAG_compile_unit",(ulong)(*value == DW_TAG_compile_unit & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_TAG_compile_unit;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_TAG_string_type",(ulong)(*value == DW_TAG_string_type & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_TAG_string_type;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_TAG_structure_type",
                     (ulong)(*value == DW_TAG_structure_type & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_TAG_structure_type;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_TAG_subroutine_type",
                     (ulong)(*value == DW_TAG_subroutine_type & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_TAG_subroutine_type;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])(io,"DW_TAG_typedef",(ulong)(*value == DW_TAG_typedef & (byte)iVar1))
  ;
  if ((char)iVar1 != '\0') {
    *value = DW_TAG_typedef;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_TAG_union_type",(ulong)(*value == DW_TAG_union_type & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_TAG_union_type;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_TAG_unspecified_parameters",
                     (ulong)(*value == DW_TAG_unspecified_parameters & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_TAG_unspecified_parameters;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])(io,"DW_TAG_variant",(ulong)(*value == DW_TAG_variant & (byte)iVar1))
  ;
  if ((char)iVar1 != '\0') {
    *value = DW_TAG_variant;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_TAG_common_block",(ulong)(*value == DW_TAG_common_block & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_TAG_common_block;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_TAG_common_inclusion",
                     (ulong)(*value == DW_TAG_common_inclusion & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_TAG_common_inclusion;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_TAG_inheritance",(ulong)(*value == DW_TAG_inheritance & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_TAG_inheritance;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_TAG_inlined_subroutine",
                     (ulong)(*value == DW_TAG_inlined_subroutine & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_TAG_inlined_subroutine;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])(io,"DW_TAG_module",(ulong)(*value == DW_TAG_module & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_TAG_module;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_TAG_ptr_to_member_type",
                     (ulong)(*value == DW_TAG_ptr_to_member_type & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_TAG_ptr_to_member_type;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_TAG_set_type",(ulong)(*value == DW_TAG_set_type & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_TAG_set_type;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_TAG_subrange_type",(ulong)(*value == DW_TAG_subrange_type & (byte)iVar1)
                    );
  if ((char)iVar1 != '\0') {
    *value = DW_TAG_subrange_type;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_TAG_with_stmt",(ulong)(*value == DW_TAG_with_stmt & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_TAG_with_stmt;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_TAG_access_declaration",
                     (ulong)(*value == DW_TAG_access_declaration & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_TAG_access_declaration;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_TAG_base_type",(ulong)(*value == DW_TAG_base_type & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_TAG_base_type;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_TAG_catch_block",(ulong)(*value == DW_TAG_catch_block & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_TAG_catch_block;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_TAG_const_type",(ulong)(*value == DW_TAG_const_type & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_TAG_const_type;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_TAG_constant",(ulong)(*value == DW_TAG_constant & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_TAG_constant;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_TAG_enumerator",(ulong)(*value == DW_TAG_enumerator & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_TAG_enumerator;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_TAG_file_type",(ulong)(*value == DW_TAG_file_type & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_TAG_file_type;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])(io,"DW_TAG_friend",(ulong)(*value == DW_TAG_friend & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_TAG_friend;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_TAG_namelist",(ulong)(*value == DW_TAG_namelist & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_TAG_namelist;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_TAG_namelist_item",(ulong)(*value == DW_TAG_namelist_item & (byte)iVar1)
                    );
  if ((char)iVar1 != '\0') {
    *value = DW_TAG_namelist_item;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_TAG_packed_type",(ulong)(*value == DW_TAG_packed_type & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_TAG_packed_type;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_TAG_subprogram",(ulong)(*value == DW_TAG_subprogram & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_TAG_subprogram;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_TAG_template_type_parameter",
                     (ulong)(*value == DW_TAG_template_type_parameter & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_TAG_template_type_parameter;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_TAG_template_value_parameter",
                     (ulong)(*value == DW_TAG_template_value_parameter & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_TAG_template_value_parameter;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_TAG_thrown_type",(ulong)(*value == DW_TAG_thrown_type & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_TAG_thrown_type;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_TAG_try_block",(ulong)(*value == DW_TAG_try_block & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_TAG_try_block;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_TAG_variant_part",(ulong)(*value == DW_TAG_variant_part & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_TAG_variant_part;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_TAG_variable",(ulong)(*value == DW_TAG_variable & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_TAG_variable;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_TAG_volatile_type",(ulong)(*value == DW_TAG_volatile_type & (byte)iVar1)
                    );
  if ((char)iVar1 != '\0') {
    *value = DW_TAG_volatile_type;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_TAG_dwarf_procedure",
                     (ulong)(*value == DW_TAG_dwarf_procedure & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_TAG_dwarf_procedure;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_TAG_restrict_type",(ulong)(*value == DW_TAG_restrict_type & (byte)iVar1)
                    );
  if ((char)iVar1 != '\0') {
    *value = DW_TAG_restrict_type;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_TAG_interface_type",
                     (ulong)(*value == DW_TAG_interface_type & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_TAG_interface_type;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_TAG_namespace",(ulong)(*value == DW_TAG_namespace & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_TAG_namespace;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_TAG_imported_module",
                     (ulong)(*value == DW_TAG_imported_module & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_TAG_imported_module;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_TAG_unspecified_type",
                     (ulong)(*value == DW_TAG_unspecified_type & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_TAG_unspecified_type;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_TAG_partial_unit",(ulong)(*value == DW_TAG_partial_unit & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_TAG_partial_unit;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_TAG_imported_unit",(ulong)(*value == DW_TAG_imported_unit & (byte)iVar1)
                    );
  if ((char)iVar1 != '\0') {
    *value = DW_TAG_imported_unit;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_TAG_condition",(ulong)(*value == DW_TAG_condition & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_TAG_condition;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_TAG_shared_type",(ulong)(*value == DW_TAG_shared_type & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_TAG_shared_type;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_TAG_type_unit",(ulong)(*value == DW_TAG_type_unit & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_TAG_type_unit;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_TAG_rvalue_reference_type",
                     (ulong)(*value == DW_TAG_rvalue_reference_type & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_TAG_rvalue_reference_type;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_TAG_template_alias",
                     (ulong)(*value == DW_TAG_template_alias & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_TAG_template_alias;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_TAG_coarray_type",(ulong)(*value == DW_TAG_coarray_type & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_TAG_coarray_type;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_TAG_generic_subrange",
                     (ulong)(*value == DW_TAG_generic_subrange & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_TAG_generic_subrange;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_TAG_dynamic_type",(ulong)(*value == DW_TAG_dynamic_type & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_TAG_dynamic_type;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_TAG_atomic_type",(ulong)(*value == DW_TAG_atomic_type & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_TAG_atomic_type;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_TAG_call_site",(ulong)(*value == DW_TAG_call_site & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_TAG_call_site;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_TAG_call_site_parameter",
                     (ulong)(*value == DW_TAG_call_site_parameter & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_TAG_call_site_parameter;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_TAG_skeleton_unit",(ulong)(*value == DW_TAG_skeleton_unit & (byte)iVar1)
                    );
  if ((char)iVar1 != '\0') {
    *value = DW_TAG_skeleton_unit;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_TAG_immutable_type",
                     (ulong)(*value == DW_TAG_immutable_type & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_TAG_immutable_type;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_TAG_MIPS_loop",(ulong)(*value == DW_TAG_MIPS_loop & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_TAG_MIPS_loop;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_TAG_format_label",(ulong)(*value == DW_TAG_format_label & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_TAG_format_label;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_TAG_function_template",
                     (ulong)(*value == DW_TAG_function_template & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_TAG_function_template;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_TAG_class_template",
                     (ulong)(*value == DW_TAG_class_template & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_TAG_class_template;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_TAG_GNU_template_template_param",
                     (ulong)(*value == DW_TAG_GNU_template_template_param & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_TAG_GNU_template_template_param;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_TAG_GNU_template_parameter_pack",
                     (ulong)(*value == DW_TAG_GNU_template_parameter_pack & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_TAG_GNU_template_parameter_pack;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_TAG_GNU_formal_parameter_pack",
                     (ulong)(*value == DW_TAG_GNU_formal_parameter_pack & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_TAG_GNU_formal_parameter_pack;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_TAG_GNU_call_site",(ulong)(*value == DW_TAG_GNU_call_site & (byte)iVar1)
                    );
  if ((char)iVar1 != '\0') {
    *value = DW_TAG_GNU_call_site;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_TAG_GNU_call_site_parameter",
                     (ulong)(*value == DW_TAG_GNU_call_site_parameter & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_TAG_GNU_call_site_parameter;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_TAG_APPLE_property",
                     (ulong)(*value == DW_TAG_APPLE_property & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_TAG_APPLE_property;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_TAG_BORLAND_property",
                     (ulong)(*value == DW_TAG_BORLAND_property & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_TAG_BORLAND_property;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_TAG_BORLAND_Delphi_string",
                     (ulong)(*value == DW_TAG_BORLAND_Delphi_string & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_TAG_BORLAND_Delphi_string;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_TAG_BORLAND_Delphi_dynamic_array",
                     (ulong)(*value == DW_TAG_BORLAND_Delphi_dynamic_array & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_TAG_BORLAND_Delphi_dynamic_array;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_TAG_BORLAND_Delphi_set",
                     (ulong)(*value == DW_TAG_BORLAND_Delphi_set & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_TAG_BORLAND_Delphi_set;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_TAG_BORLAND_Delphi_variant",
                     (ulong)(*value == DW_TAG_BORLAND_Delphi_variant & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_TAG_BORLAND_Delphi_variant;
  }
  IO::enumFallback<llvm::yaml::Hex16,llvm::dwarf::Tag>(io,value);
  return;
}

Assistant:

static void enumeration(IO &io, dwarf::Tag &value) {
#include "llvm/BinaryFormat/Dwarf.def"
    io.enumFallback<Hex16>(value);
  }